

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O2

ufile_error ufile_load_config_from_json(char *json_buf,ufile_config *cfg)

{
  int iVar1;
  cJSON *item;
  char *pcVar2;
  ufile_config *puVar3;
  ulong uVar4;
  cJSON *pcVar5;
  ufile_error uVar6;
  
  item = cJSON_Parse(json_buf);
  if (item == (cJSON *)0x0) {
    uVar4 = 0xfffffffffffffffe;
    pcVar2 = cJSON_GetErrorPtr();
  }
  else {
    pcVar5 = (cJSON *)&item->child;
    while (pcVar5 = pcVar5->next, pcVar5 != (cJSON *)0x0) {
      pcVar2 = pcVar5->string;
      iVar1 = strcmp(pcVar2,"public_key");
      puVar3 = cfg;
      if (iVar1 == 0) goto LAB_00103827;
      iVar1 = strcmp(pcVar2,"private_key");
      puVar3 = (ufile_config *)&cfg->private_key;
      if (iVar1 == 0) goto LAB_00103827;
      iVar1 = strcmp(pcVar2,"file_host");
      puVar3 = (ufile_config *)&cfg->file_host;
      if (iVar1 == 0) goto LAB_00103827;
      iVar1 = strcmp(pcVar2,"bucket_host");
      puVar3 = (ufile_config *)&cfg->bucket_host;
      if (iVar1 == 0) {
LAB_00103827:
        pcVar2 = ufile_strconcat(pcVar5->valuestring,0);
        puVar3->public_key = pcVar2;
      }
    }
    cJSON_Delete(item);
    uVar6 = config_validation(*cfg);
    pcVar2 = uVar6.message;
    uVar4 = (ulong)(uint)uVar6.code;
  }
  uVar6._0_8_ = uVar4 & 0xffffffff;
  uVar6.message = pcVar2;
  return uVar6;
}

Assistant:

struct ufile_error
ufile_load_config_from_json(const char* json_buf, struct ufile_config *cfg){
    struct ufile_error error = NO_ERROR;
    struct cJSON *json = cJSON_Parse(json_buf); 
    if(json==NULL){
        error.code = UFILE_CONFIG_ERROR_CODE;
        error.message = cJSON_GetErrorPtr();
        return error;
    }
    struct cJSON *item = json->child;
    while(item!=NULL){
        if (strcmp(item->string, "public_key") == 0){
            cfg->public_key = ufile_strconcat(item->valuestring,NULL);
        }else if(strcmp(item->string,"private_key") == 0){
            cfg->private_key = ufile_strconcat(item->valuestring, NULL);
        }else if(strcmp(item->string,"file_host") == 0){
            cfg->file_host = ufile_strconcat(item->valuestring, NULL);
        }else if(strcmp(item->string,"bucket_host") == 0){
            cfg->bucket_host = ufile_strconcat(item->valuestring, NULL);
        }
        item = item->next;
    }
    cJSON_Delete(json);
    error = config_validation(*cfg);
    return error;
}